

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813_9.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementHexaANCF_3813_9::CalcCoordMatrix
          (ChElementHexaANCF_3813_9 *this,ChMatrixNM<double,_11,_3> *d)

{
  pointer psVar1;
  long lVar2;
  element_type *peVar3;
  double *pdVar4;
  long lVar5;
  
  psVar1 = (this->m_nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pdVar4 = (d->super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>).m_storage.m_data.
           array + 2;
  lVar5 = 0;
  do {
    lVar2 = *(long *)((long)&(psVar1->
                             super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr + lVar5);
    ((plain_array<double,_33,_1,_0> *)(pdVar4 + -2))->array[0] = *(double *)(lVar2 + 0x20);
    pdVar4[-1] = *(double *)(lVar2 + 0x28);
    *pdVar4 = *(double *)(lVar2 + 0x30);
    lVar5 = lVar5 + 0x10;
    pdVar4 = pdVar4 + 3;
  } while (lVar5 != 0x80);
  peVar3 = (this->m_central_node).
           super___shared_ptr<chrono::fea::ChNodeFEAcurv,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (d->super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>).m_storage.m_data.array[0x18] =
       *(double *)&(peVar3->super_ChNodeFEAbase).field_0x20;
  (d->super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>).m_storage.m_data.array[0x19] =
       *(double *)&peVar3->field_0x28;
  (d->super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>).m_storage.m_data.array[0x1a] =
       *(double *)&peVar3->field_0x30;
  (d->super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>).m_storage.m_data.array[0x1b] =
       (peVar3->m_ryy).m_data[0];
  (d->super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>).m_storage.m_data.array[0x1c] =
       (peVar3->m_ryy).m_data[1];
  (d->super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>).m_storage.m_data.array[0x1d] =
       (peVar3->m_ryy).m_data[2];
  (d->super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>).m_storage.m_data.array[0x1e] =
       (peVar3->m_rzz).m_data[0];
  (d->super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>).m_storage.m_data.array[0x1f] =
       (peVar3->m_rzz).m_data[1];
  (d->super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>).m_storage.m_data.array[0x20] =
       (peVar3->m_rzz).m_data[2];
  return;
}

Assistant:

void ChElementHexaANCF_3813_9::CalcCoordMatrix(ChMatrixNM<double, 11, 3>& d) {
    for (int i = 0; i < 8; i++) {
        const ChVector<>& pos = m_nodes[i]->GetPos();
        d(i, 0) = pos.x();
        d(i, 1) = pos.y();
        d(i, 2) = pos.z();
    }

    const ChVector<>& rxx = m_central_node->GetCurvatureXX();
    const ChVector<>& ryy = m_central_node->GetCurvatureYY();
    const ChVector<>& rzz = m_central_node->GetCurvatureZZ();

    d(8, 0) = rxx.x();
    d(8, 1) = rxx.y();
    d(8, 2) = rxx.z();

    d(9, 0) = ryy.x();
    d(9, 1) = ryy.y();
    d(9, 2) = ryy.z();

    d(10, 0) = rzz.x();
    d(10, 1) = rzz.y();
    d(10, 2) = rzz.z();
}